

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

Value * __thiscall
duckdb::Deserializer::ReadPropertyWithExplicitDefault<duckdb::Value>
          (Deserializer *this,field_id_t field_id,char *tag,Value *default_value)

{
  ulong uVar1;
  undefined2 in_CX;
  undefined6 in_register_0000000a;
  undefined2 in_DX;
  long *in_RSI;
  Value *in_RDI;
  Value *in_R8;
  type *ret;
  Value *in_stack_ffffffffffffff98;
  Deserializer *in_stack_ffffffffffffffc8;
  
  uVar1 = (**(code **)(*in_RSI + 0x20))(in_RSI,in_DX,CONCAT62(in_register_0000000a,in_CX),in_DX);
  if ((uVar1 & 1) == 0) {
    (**(code **)(*in_RSI + 0x28))(in_RSI,0);
    Value::Value(in_R8,in_stack_ffffffffffffff98);
  }
  else {
    Read<duckdb::Value>(in_stack_ffffffffffffffc8);
    (**(code **)(*in_RSI + 0x28))(in_RSI,1);
  }
  return in_RDI;
}

Assistant:

inline T ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(default_value);
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}